

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
ast::FunctionLiteral::toString_abi_cxx11_(string *__return_storage_ptr__,FunctionLiteral *this)

{
  pointer ppIVar1;
  int i;
  long lVar2;
  ostringstream msg;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"define ");
  if (this->header != (Identifier *)0x0) {
    ast::operator<<((ostream *)local_1a0,this->header);
  }
  std::operator<<((ostream *)local_1a0,"(");
  for (lVar2 = 0;
      ppIVar1 = (this->parameters).
                super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->parameters).
                                  super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
      lVar2 = lVar2 + 1) {
    if (lVar2 != 0) {
      std::operator<<((ostream *)local_1a0,", ");
      ppIVar1 = (this->parameters).
                super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    ast::operator<<((ostream *)local_1a0,ppIVar1[lVar2]);
  }
  std::operator<<((ostream *)local_1a0,")");
  ast::operator<<((ostream *)local_1a0,this->body);
  std::endl<char,std::char_traits<char>>((ostream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::FunctionLiteral::toString() const
{
    std::ostringstream msg;
    msg << "define ";
    if(header != nullptr){
        msg << header;
    }
    msg << "(";
    for(int i{0}; i < (int)parameters.size(); i++){
        if(i > 0 && i+1 <= (int)parameters.size()){
            msg << ", ";
        }
        msg << parameters[i];
    }
    msg << ")";
    msg << body;
    msg << std::endl;
    return msg.str();
}